

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O2

uint64_t __thiscall roaring::Roaring64Map::cardinality(Roaring64Map *this)

{
  bool bVar1;
  unsigned_long uVar2;
  length_error *this_00;
  
  bVar1 = isFull(this);
  if (!bVar1) {
    uVar2 = std::
            accumulate<std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,roaring::Roaring>>,unsigned_long,roaring::Roaring64Map::cardinality()const::_lambda(unsigned_long,std::pair<unsigned_int_const,roaring::Roaring>const&)_1_>
                      ((this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       &(this->roarings)._M_t._M_impl.super__Rb_tree_header,0);
    return uVar2;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error
            (this_00,"bitmap is full, cardinality is 2^64, unable to represent in a 64-bit integer")
  ;
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

uint64_t cardinality() const {
        if (isFull()) {
#if ROARING_EXCEPTIONS
            throw std::length_error(
                "bitmap is full, cardinality is 2^64, "
                "unable to represent in a 64-bit integer");
#else
            ROARING_TERMINATE(
                "bitmap is full, cardinality is 2^64, "
                "unable to represent in a 64-bit integer");
#endif
        }
        return std::accumulate(
            roarings.cbegin(), roarings.cend(), (uint64_t)0,
            [](uint64_t previous,
               const std::pair<const uint32_t, Roaring> &map_entry) {
                return previous + map_entry.second.cardinality();
            });
    }